

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTypedConstraint.cpp
# Opt level: O1

void __thiscall
btAngularLimit::set(btAngularLimit *this,btScalar low,btScalar high,btScalar _softness,
                   btScalar _biasFactor,btScalar _relaxationFactor)

{
  btScalar bVar1;
  float fVar2;
  
  fVar2 = (high - low) * 0.5;
  this->m_halfRange = fVar2;
  bVar1 = fmodf(low + fVar2,6.2831855);
  if (-3.1415927 <= bVar1) {
    if (3.1415927 < bVar1) {
      bVar1 = bVar1 + -6.2831855;
    }
  }
  else {
    bVar1 = bVar1 + 6.2831855;
  }
  this->m_center = bVar1;
  this->m_softness = _softness;
  this->m_biasFactor = _biasFactor;
  this->m_relaxationFactor = _relaxationFactor;
  return;
}

Assistant:

void btAngularLimit::set(btScalar low, btScalar high, btScalar _softness, btScalar _biasFactor, btScalar _relaxationFactor)
{
	m_halfRange = (high - low) / 2.0f;
	m_center = btNormalizeAngle(low + m_halfRange);
	m_softness =  _softness;
	m_biasFactor = _biasFactor;
	m_relaxationFactor = _relaxationFactor;
}